

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_acl_text(archive_entry *entry,wchar_t flags)

{
  wchar_t wVar1;
  int *piVar2;
  char *in_RDI;
  char *p;
  archive_string_conv *in_stack_00000028;
  size_t *in_stack_00000030;
  char **in_stack_00000038;
  wchar_t in_stack_00000044;
  archive_acl *in_stack_00000048;
  undefined8 local_18;
  
  wVar1 = archive_acl_text_l(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030
                             ,in_stack_00000028);
  if (wVar1 != L'\0') {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(p._4_4_,in_RDI);
    }
  }
  return local_18;
}

Assistant:

const char *
archive_entry_acl_text(struct archive_entry *entry, int flags)
{
	const char *p;
	if (archive_acl_text_l(&entry->acl, flags, &p, NULL, NULL) != 0
	    && errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (p);
}